

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

bam1_t * bam_copy1(bam1_t *bdst,bam1_t *bsrc)

{
  uint uVar1;
  int local_24;
  uint8_t *puStack_20;
  int m_data;
  uint8_t *data;
  bam1_t *bsrc_local;
  bam1_t *bdst_local;
  
  puStack_20 = bdst->data;
  local_24 = bdst->m_data;
  if (local_24 < bsrc->l_data) {
    uVar1 = bsrc->l_data - 1;
    uVar1 = (int)uVar1 >> 1 | uVar1;
    uVar1 = (int)uVar1 >> 2 | uVar1;
    uVar1 = (int)uVar1 >> 4 | uVar1;
    uVar1 = (int)uVar1 >> 8 | uVar1;
    local_24 = ((int)uVar1 >> 0x10 | uVar1) + 1;
    puStack_20 = (uint8_t *)realloc(puStack_20,(long)local_24);
  }
  memcpy(puStack_20,bsrc->data,(long)bsrc->l_data);
  memcpy(bdst,bsrc,0x38);
  bdst->m_data = local_24;
  bdst->data = puStack_20;
  return bdst;
}

Assistant:

bam1_t *bam_copy1(bam1_t *bdst, const bam1_t *bsrc)
{
    uint8_t *data = bdst->data;
    int m_data = bdst->m_data;   // backup data and m_data
    if (m_data < bsrc->l_data) { // double the capacity
        m_data = bsrc->l_data; kroundup32(m_data);
        data = (uint8_t*)realloc(data, m_data);
    }
    memcpy(data, bsrc->data, bsrc->l_data); // copy var-len data
    *bdst = *bsrc; // copy the rest
    // restore the backup
    bdst->m_data = m_data;
    bdst->data = data;
    return bdst;
}